

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

string * __thiscall
detail::GeneratedMakeCommand::QuotedPrintable_abi_cxx11_
          (string *__return_storage_ptr__,GeneratedMakeCommand *this)

{
  bool bVar1;
  int in_R8D;
  string_view str;
  undefined1 auVar2 [16];
  string local_90;
  string local_70;
  reference local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *pcStack_28;
  int flags;
  char *sep;
  GeneratedMakeCommand *local_18;
  GeneratedMakeCommand *this_local;
  string *output;
  
  sep._7_1_ = 0;
  local_18 = this;
  this_local = (GeneratedMakeCommand *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcStack_28 = "";
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->PrimaryCommand);
  arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->PrimaryCommand);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&arg), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    str._M_len = auVar2._8_8_;
    str._M_str._0_4_ = 0x100;
    str._M_str._4_4_ = 0;
    cmOutputConverter::EscapeForShell_abi_cxx11_(&local_90,auVar2._0_8_,str,in_R8D);
    cmStrCat<char_const*&,std::__cxx11::string>(&local_70,&stack0xffffffffffffffd8,&local_90);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pcStack_28 = " ";
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMakeCommand::QuotedPrintable() const
{
  std::string output;
  const char* sep = "";
  int flags = 0;
#if !defined(_WIN32)
  flags |= cmOutputConverter::Shell_Flag_IsUnix;
#endif
  for (auto const& arg : this->PrimaryCommand) {
    output += cmStrCat(sep, cmOutputConverter::EscapeForShell(arg, flags));
    sep = " ";
  }
  return output;
}